

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O1

void anon_unknown.dwarf_608d4::assert_not_in1(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  string msg;
  vector<int,_std::allocator<int>_> local_c0;
  string local_a0;
  Assert local_80 [5];
  
  local_a0._M_dataplus._M_p = (pointer)0x100000000;
  local_a0._M_string_length = 0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,__l,(allocator_type *)local_80);
  local_a0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_a0._M_string_length = CONCAT44(local_a0._M_string_length._4_4_,0x13b);
  UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>
            ((Assert *)&local_a0,3,&local_c0);
  local_80[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_80[0].m_line = 0x13c;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"ASSERT_NOT_IN should have fired here.","");
  UnitTests::Assert::Fail(local_80,&local_a0);
}

Assistant:

TEST(assert_not_in1)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_NOT_IN(3, v);
            FAIL("ASSERT_NOT_IN should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();
            std::string expected =
                "error A1000: Assertion failure : Did not expect container to contain 3, actual contents :\n"
                "\t[0, 1, 2, 3]";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_NOT_IN", __FILE__, __LINE__);
            }
        }
    }